

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumofdigits.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  istream *piVar1;
  ostream *poVar2;
  int i;
  size_type sVar3;
  int iVar4;
  string line;
  ifstream stream;
  
  std::ifstream::ifstream((istream *)&stream,argv[1],_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stream,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    iVar4 = 0;
    for (sVar3 = 0; line._M_string_length != sVar3; sVar3 = sVar3 + 1) {
      iVar4 = iVar4 + line._M_dataplus._M_p[sVar3] + -0x30;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);

    string line;
    int sum;
    while (getline(stream, line)) {
        sum = 0;
        for(int i = 0; i < line.length(); i++){
            sum += line[i] - (int)'0';
        }
        std::cout << sum << std::endl;
    }
    return 0;
}